

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

void helicsTranslatorSetTag(HelicsTranslator trans,char *tagname,char *tagvalue,HelicsError *err)

{
  string_view tag;
  TranslatorObject *pTVar1;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  __sv_type _Var2;
  TranslatorObject *transObj;
  HelicsError *in_stack_ffffffffffffffa0;
  Translator *this;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  Interface *local_48;
  __sv_type in_stack_ffffffffffffffc8;
  
  pTVar1 = getTranslatorObj(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (pTVar1 != (TranslatorObject *)0x0) {
    this = pTVar1->transPtr;
    if (in_RSI == 0) {
      in_stack_ffffffffffffffc8 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    if (in_RDX == 0) {
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      local_48 = (Interface *)_Var2._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    tag._M_str = in_RCX;
    tag._M_len = (size_t)pTVar1;
    helics::Interface::setTag(local_48,tag,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void helicsTranslatorSetTag(HelicsTranslator trans, const char* tagname, const char* tagvalue, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setTag(AS_STRING_VIEW(tagname), AS_STRING_VIEW(tagvalue));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}